

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS
ref_sort_search_glob(REF_INT n,REF_GLOB *ascending_list,REF_GLOB target,REF_INT *position)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  *position = -1;
  if ((n < 1) || (target < *ascending_list)) {
    return 5;
  }
  uVar1 = (ulong)(n - 1U);
  if (target <= ascending_list[uVar1]) {
    uVar3 = 0;
    if ((*ascending_list == target) || (uVar3 = n - 1U, ascending_list[uVar1] == target)) {
LAB_00143b56:
      *position = uVar3;
      return 0;
    }
    uVar2 = 0;
    while ((uVar3 = (uint)n >> 1, uVar2 < uVar3 && ((int)uVar3 < (int)uVar1))) {
      if (target < ascending_list[uVar3]) {
        uVar1 = (ulong)uVar3;
        uVar3 = uVar2;
      }
      else if (ascending_list[uVar3] == target) goto LAB_00143b56;
      uVar2 = uVar3;
      n = (int)uVar1 + uVar3;
    }
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_sort_search_glob(REF_INT n, REF_GLOB *ascending_list,
                                        REF_GLOB target, REF_INT *position) {
  REF_INT lower, upper, mid;

  *position = REF_EMPTY;

  if (n < 1) return REF_NOT_FOUND;

  if (target < ascending_list[0] || target > ascending_list[n - 1])
    return REF_NOT_FOUND;

  lower = 0;
  upper = n - 1;
  mid = n >> 1; /* fast divide by two */

  if (target == ascending_list[lower]) {
    *position = lower;
    return REF_SUCCESS;
  }
  if (target == ascending_list[upper]) {
    *position = upper;
    return REF_SUCCESS;
  }

  while ((lower < mid) && (mid < upper)) {
    if (target >= ascending_list[mid]) {
      if (target == ascending_list[mid]) {
        *position = mid;
        return REF_SUCCESS;
      }
      lower = mid;
    } else {
      upper = mid;
    }
    mid = (lower + upper) >> 1;
  }

  return REF_NOT_FOUND;
}